

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

void __thiscall
MarkdownHighlighter::setHeadingStyles
          (MarkdownHighlighter *this,HighlighterState rule,QRegularExpressionMatch *match,
          int capturedGroup)

{
  int iVar1;
  uint uVar2;
  QTextCharFormat *this_00;
  QTextFormat *pQVar3;
  qreal size;
  QTextCharFormat linkFmt;
  HighlighterState local_30;
  HighlighterState state;
  
  state = QSyntaxHighlighter::currentBlockState();
  this_00 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                      (&_formats,&state);
  if (rule == Link) {
    local_30 = Link;
    pQVar3 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                        (&_formats,&local_30)->super_QTextFormat;
    QTextFormat::QTextFormat(&linkFmt.super_QTextFormat,pQVar3);
    size = QTextCharFormat::fontPointSize(this_00);
    QTextCharFormat::setFontPointSize(&linkFmt,size);
    if (capturedGroup == 1) {
      iVar1 = QRegularExpressionMatch::capturedStart((int)match);
      uVar2 = QRegularExpressionMatch::capturedLength((int)match);
      QSyntaxHighlighter::setFormat((int)this,iVar1,(QTextCharFormat *)(ulong)uVar2);
    }
    QTextFormat::~QTextFormat(&linkFmt.super_QTextFormat);
  }
  return;
}

Assistant:

void MarkdownHighlighter::setHeadingStyles(HighlighterState rule,
                                           const QRegularExpressionMatch &match,
                                           const int capturedGroup) {
    auto state = static_cast<HighlighterState>(currentBlockState());
    const QTextCharFormat &f = _formats[state];

    if (rule == HighlighterState::Link) {
        auto linkFmt = _formats[Link];
        linkFmt.setFontPointSize(f.fontPointSize());
        if (capturedGroup == 1) {
            setFormat(match.capturedStart(capturedGroup),
                      match.capturedLength(capturedGroup), linkFmt);
        }
        return;
    }
}